

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O1

void __thiscall
SemanticAnalyserTest_FunctionDefinitionsThrows_Test::
~SemanticAnalyserTest_FunctionDefinitionsThrows_Test
          (SemanticAnalyserTest_FunctionDefinitionsThrows_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, FunctionDefinitionsThrows)
{
  std::string source = R"SRC(
  fn f(x: f32): f32 { ret 1; }
  fn g(x: f32, y: f32): f32 { ret x + y; }

  fn main(): f32
  {
    ret 0;
  }
  )SRC";
  nothrowTest(source);
}